

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,float label,float prediction,
          size_t num_features,bool progress_add,float progress_arg)

{
  long lVar1;
  ostream *this_00;
  string local_358;
  string local_338;
  ostringstream label_buf;
  undefined8 local_310 [2];
  uint auStack_300 [88];
  ostringstream pred_buf;
  undefined8 local_198 [2];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&label_buf);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pred_buf);
  *(undefined8 *)((long)local_310 + *(long *)(_label_buf + -0x18) + 8) = 8;
  std::operator<<(&label_buf,0x20);
  lVar1 = *(long *)(_label_buf + -0x18);
  if (3.4028235e+38 <= label) {
    *(uint *)((long)auStack_300 + lVar1) = *(uint *)((long)auStack_300 + lVar1) & 0xffffff4f | 0x20;
    std::operator<<((ostream *)&label_buf," unknown");
  }
  else {
    *(undefined8 *)((long)local_310 + lVar1) = 4;
    *(uint *)((long)auStack_300 + *(long *)(_label_buf + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_label_buf + -0x18)) & 0xfffffefb | 4;
    *(uint *)((long)auStack_300 + *(long *)(_label_buf + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_label_buf + -0x18)) & 0xffffff4f | 0x80;
    std::ostream::operator<<(&label_buf,label);
  }
  *(undefined8 *)((long)local_198 + *(long *)(_pred_buf + -0x18) + 8) = 8;
  *(undefined8 *)((long)local_198 + *(long *)(_pred_buf + -0x18)) = 4;
  *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) & 0xfffffefb | 4;
  *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) & 0xffffff4f | 0x80;
  this_00 = std::operator<<(&pred_buf,0x20);
  std::ostream::operator<<(this_00,prediction);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  print_update(this,holdout_set_off,current_pass,&local_338,&local_358,num_features,progress_add,
               progress_arg);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pred_buf);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&label_buf);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, float label, float prediction, size_t num_features,
      bool progress_add, float progress_arg)
  {
    std::ostringstream label_buf, pred_buf;

    label_buf << std::setw(col_current_label) << std::setfill(' ');
    if (label < FLT_MAX)
      label_buf << std::setprecision(prec_current_label) << std::fixed << std::right << label;
    else
      label_buf << std::left << " unknown";

    pred_buf << std::setw(col_current_predict) << std::setprecision(prec_current_predict) << std::fixed << std::right
             << std::setfill(' ') << prediction;

    print_update(
        holdout_set_off, current_pass, label_buf.str(), pred_buf.str(), num_features, progress_add, progress_arg);
  }